

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftoutln.c
# Opt level: O2

void FT_Outline_Translate(FT_Outline *outline,FT_Pos xOffset,FT_Pos yOffset)

{
  short sVar1;
  FT_Vector *pFVar2;
  int iVar3;
  
  if (outline != (FT_Outline *)0x0) {
    pFVar2 = outline->points;
    sVar1 = outline->n_points;
    for (iVar3 = 0; iVar3 < sVar1; iVar3 = iVar3 + 1) {
      pFVar2->x = pFVar2->x + xOffset;
      pFVar2->y = pFVar2->y + yOffset;
      pFVar2 = pFVar2 + 1;
    }
  }
  return;
}

Assistant:

FT_EXPORT_DEF( void )
  FT_Outline_Translate( const FT_Outline*  outline,
                        FT_Pos             xOffset,
                        FT_Pos             yOffset )
  {
    FT_UShort   n;
    FT_Vector*  vec;


    if ( !outline )
      return;

    vec = outline->points;

    for ( n = 0; n < outline->n_points; n++ )
    {
      vec->x = ADD_LONG( vec->x, xOffset );
      vec->y = ADD_LONG( vec->y, yOffset );
      vec++;
    }
  }